

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O3

void __thiscall gimage::PNGImageIO::load(PNGImageIO *this,ImageU8 *image,uint8 *data,size_t length)

{
  uchar *puVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  __jmp_buf_tag *__env;
  void *pvVar8;
  IOException *pIVar9;
  void *pvVar10;
  size_t __n;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long d;
  void *pvVar15;
  ulong h;
  png_structp png;
  png_infop info;
  png_infop end;
  PNGReadData dp;
  long local_90;
  long local_88;
  string local_80;
  long local_60;
  uint local_54;
  void *local_50;
  uint8 *local_48;
  size_t local_40;
  undefined8 local_38;
  
  iVar5 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[0xd])(this,data,length);
  if ((char)iVar5 == '\0') {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Can only load PNG image format","");
    gutil::IOException::IOException(pIVar9,&local_80);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_90 = png_create_read_struct("1.6.37",0,0);
  if (local_90 == 0) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Cannot allocate handle for reading PNG files","");
    gutil::IOException::IOException(pIVar9,&local_80);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_38 = 0;
  local_48 = data;
  local_40 = length;
  png_set_read_fn(local_90,&local_48,anon_unknown_2::readPNGData);
  local_88 = png_create_info_struct(local_90);
  if (local_88 == 0) {
    png_destroy_read_struct(&local_90,0);
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar9,&local_80);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_60 = png_create_info_struct(local_90);
  if (local_60 == 0) {
    png_destroy_read_struct(&local_90,&local_88,0);
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar9,&local_80);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_90,longjmp,200);
  iVar5 = _setjmp(__env);
  if (iVar5 != 0) {
    png_destroy_read_struct(&local_90,&local_88,&local_60);
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Cannot read PNG image from memory","");
    gutil::IOException::IOException(pIVar9,&local_80);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png_read_info(local_90,local_88);
  uVar6 = png_get_image_width(local_90,local_88);
  uVar7 = png_get_image_height(local_90,local_88);
  h = (ulong)uVar7;
  bVar3 = png_get_color_type(local_90,local_88);
  d = 4;
  if (bVar3 != 6) {
    d = (ulong)((bVar3 & 0xfe) == 2) * 2 + 1;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,(ulong)uVar6,h,d);
  sVar2 = image->n;
  __n = -sVar2;
  if (0 < (long)sVar2) {
    __n = sVar2;
  }
  memset(image->pixel,0,__n);
  if (bVar3 == 3) {
    png_set_palette_to_rgb(local_90);
  }
  bVar4 = png_get_bit_depth(local_90,local_88);
  if (8 < bVar4) {
    png_destroy_read_struct(&local_90,&local_88,&local_60);
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"PNG image with <= 8 bits expected","");
    gutil::IOException::IOException(pIVar9,&local_80);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  if (bVar4 != 8 && bVar3 == 0) {
    png_set_expand_gray_1_2_4_to_8(local_90);
  }
  iVar5 = png_get_rowbytes(local_90,local_88);
  uVar11 = 0xffffffffffffffff;
  if (-1 < (long)((long)iVar5 * h)) {
    uVar11 = (long)iVar5 * h;
  }
  local_50 = operator_new__(uVar11);
  pvVar8 = operator_new__(h * 8);
  pvVar15 = local_50;
  if (h == 0) {
    png_read_image(local_90,pvVar8);
    pvVar15 = local_50;
  }
  else {
    uVar11 = 0;
    pvVar10 = local_50;
    do {
      *(void **)((long)pvVar8 + uVar11 * 8) = pvVar10;
      uVar11 = uVar11 + 1;
      pvVar10 = (void *)((long)pvVar10 + (long)iVar5);
    } while (h != uVar11);
    local_54 = uVar7;
    png_read_image(local_90,pvVar8);
    if (local_54 != 0) {
      uVar11 = 0;
      do {
        if (uVar6 != 0) {
          uVar13 = 0;
          uVar12 = uVar13;
          do {
            uVar12 = (ulong)(int)uVar12;
            lVar14 = 0;
            do {
              puVar1 = (uchar *)(*(long *)((long)pvVar8 + uVar11 * 8) + uVar12);
              uVar12 = uVar12 + 1;
              image->img[lVar14][uVar11][uVar13] = *puVar1;
              lVar14 = lVar14 + 1;
            } while (d != lVar14);
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar6);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != h);
    }
  }
  operator_delete__(pvVar8);
  operator_delete__(pvVar15);
  png_destroy_read_struct(&local_90,&local_88,&local_60);
  return;
}

Assistant:

void PNGImageIO::load(ImageU8 &image, gutil::uint8 *data, size_t length) const
{
  if (!handles(data, length))
  {
    throw gutil::IOException("Can only load PNG image format");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  PNGReadData dp;
  dp.data=data;
  dp.length=length;
  dp.i=0;

  png_set_read_fn(png, &dp, readPNGData);

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    throw gutil::IOException("Cannot read PNG image from memory");
  }

  // read header data

  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB)
  {
    depth=3;
  }

  if (color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=4;
  }

  image.setSize(width, height, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  // make sure that there are 8 Bits per color channel

  int bits=png_get_bit_depth(png, info);

  if (bits > 8)
  {
    png_destroy_read_struct(&png, &info, &end);
    throw gutil::IOException("PNG image with <= 8 bits expected");
  }

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  for (long k=0; k<height; k++)
  {
    int j=0;

    for (long i=0; i<width; i++)
    {
      for (int d=0; d<depth; d++)
      {
        image.set(i, k, d, static_cast<ImageU8::store_t>(row[k][j++]));
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
}